

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O2

size_t Potassco::convert_seq<unsigned_int,unsigned_int*>
                 (char *x,size_t maxLen,uint *out,char sep,char **errPos)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *local_58;
  uint temp;
  ulong local_48;
  char *local_40;
  char **local_38;
  
  if (x == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    cVar1 = *x;
    local_58 = x;
    if (cVar1 == '[') {
      local_58 = x + 1;
    }
    local_48 = (ulong)(cVar1 == '[');
    sVar3 = 0;
    local_40 = x;
    local_38 = errPos;
    while( true ) {
      sVar4 = maxLen;
      if ((maxLen == sVar3) ||
         (iVar2 = xconvert(local_58,&temp,&local_58,(int)sep), sVar4 = sVar3, iVar2 == 0))
      goto LAB_001166f3;
      out[sVar3] = temp;
      if ((*local_58 == '\0') || ((*local_58 != sep || (local_58[1] == '\0')))) break;
      local_58 = local_58 + 1;
      sVar3 = sVar3 + 1;
    }
    sVar4 = sVar3 + 1;
LAB_001166f3:
    if ((cVar1 != '[') || (*local_58 == ']')) {
      local_40 = local_58 + local_48;
    }
    if (local_38 != (char **)0x0) {
      *local_38 = local_40;
    }
  }
  return sVar4;
}

Assistant:

std::size_t convert_seq(const char* x, std::size_t maxLen, OutIt out, char sep, const char** errPos = 0) {
	if (!x) { return 0; }
	const char* n = x;
	std::size_t t = 0;
	std::size_t b = 0;
	if (*n == '[') { ++b; ++n; }
	while (t != maxLen) {
		T temp;
		if (!xconvert(n, temp, &n, sep)) break;
		*out++ = temp;
		++t;
		if (!*n || *n != (char)sep || !n[1]) break;
		n = n+1;
	}
	if (!b || *n == ']') { n += b; }
	else                 { n  = x; }
	if (errPos) *errPos = n;
	return t;
}